

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O1

char * cJSON_SetValuestring(cJSON *object,char *valuestring)

{
  size_t sVar1;
  size_t sVar2;
  char *pcVar3;
  
  if (((object != (cJSON *)0x0) && ((object->type & 0x110U) == 0x10)) &&
     (pcVar3 = object->valuestring, valuestring != (char *)0x0 && pcVar3 != (char *)0x0)) {
    sVar1 = strlen(valuestring);
    sVar2 = strlen(pcVar3);
    if (sVar2 < sVar1) {
      sVar1 = strlen(valuestring);
      pcVar3 = (char *)(*global_hooks.allocate)(sVar1 + 1);
      if (pcVar3 == (char *)0x0) {
        pcVar3 = (char *)0x0;
      }
      else {
        memcpy(pcVar3,valuestring,sVar1 + 1);
      }
      if (pcVar3 != (char *)0x0) {
        if (object->valuestring != (char *)0x0) {
          (*global_hooks.deallocate)(object->valuestring);
        }
        object->valuestring = pcVar3;
        return pcVar3;
      }
    }
    else if (pcVar3 + sVar2 < valuestring || valuestring + sVar1 < pcVar3) {
      strcpy(pcVar3,valuestring);
      return object->valuestring;
    }
  }
  return (char *)0x0;
}

Assistant:

CJSON_PUBLIC(char*) cJSON_SetValuestring(cJSON *object, const char *valuestring)
{
    char *copy = NULL;
    size_t v1_len;
    size_t v2_len;
    /* if object's type is not cJSON_String or is cJSON_IsReference, it should not set valuestring */
    if ((object == NULL) || !(object->type & cJSON_String) || (object->type & cJSON_IsReference))
    {
        return NULL;
    }
    /* return NULL if the object is corrupted or valuestring is NULL */
    if (object->valuestring == NULL || valuestring == NULL)
    {
        return NULL;
    }

    v1_len = strlen(valuestring);
    v2_len = strlen(object->valuestring);

    if (v1_len <= v2_len)
    {
        /* strcpy does not handle overlapping string: [X1, X2] [Y1, Y2] => X2 < Y1 or Y2 < X1 */
        if (!( valuestring + v1_len < object->valuestring || object->valuestring + v2_len < valuestring ))
        {
            return NULL;
        }
        strcpy(object->valuestring, valuestring);
        return object->valuestring;
    }
    copy = (char*) cJSON_strdup((const unsigned char*)valuestring, &global_hooks);
    if (copy == NULL)
    {
        return NULL;
    }
    if (object->valuestring != NULL)
    {
        cJSON_free(object->valuestring);
    }
    object->valuestring = copy;

    return copy;
}